

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void fs_init(LexState *ls,FuncState *fs)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 *puVar3;
  uint64_t uVar4;
  GCtab *pGVar5;
  lua_State *in_RSI;
  undefined8 *in_RDI;
  lua_State *L;
  TValue *pTVar6;
  
  pTVar6 = (TValue *)in_RDI[1];
  uVar2 = *in_RDI;
  in_RSI->maxstack = (MRef)(int)uVar2;
  in_RSI->stack = (MRef)(int)((ulong)uVar2 >> 0x20);
  *in_RDI = in_RSI;
  *(undefined8 **)&in_RSI->glref = in_RDI;
  *(undefined4 *)((long)&in_RSI[1].base + 4) = *(undefined4 *)((long)in_RDI + 0x8c);
  in_RSI->base = pTVar6;
  (in_RSI->openupval).gcptr32 = 0;
  (in_RSI->env).gcptr32 = 0;
  *(undefined4 *)&in_RSI->cframe = 0xffffffff;
  *(undefined4 *)((long)&in_RSI->cframe + 4) = 0;
  in_RSI[1].nextgc.gcptr32 = 0;
  *(undefined4 *)&in_RSI->field_0x3c = 0;
  in_RSI->stacksize = 0;
  *(undefined1 *)((long)&in_RSI[1].top + 3) = 0;
  in_RSI->top = (TValue *)0x0;
  *(undefined1 *)&in_RSI[1].top = 0;
  *(undefined1 *)((long)&in_RSI[1].top + 2) = 1;
  pGVar5 = lj_tab_new(in_RSI,(uint32_t)((ulong)pTVar6 >> 0x20),(uint32_t)pTVar6);
  *(GCtab **)in_RSI = pGVar5;
  puVar3 = (undefined4 *)pTVar6[3].u64;
  uVar1 = in_RSI->nextgc;
  *puVar3 = uVar1;
  puVar3[1] = 0xfffffff4;
  uVar4 = pTVar6[3].u64;
  pTVar6[3].u64 = uVar4 + 8;
  if ((ulong)pTVar6[4].u32.lo <= uVar4 + 8) {
    lj_state_growstack1((lua_State *)0x14ee15);
  }
  return;
}

Assistant:

static void fs_init(LexState *ls, FuncState *fs)
{
  lua_State *L = ls->L;
  fs->prev = ls->fs; ls->fs = fs;  /* Append to list. */
  fs->ls = ls;
  fs->vbase = ls->vtop;
  fs->L = L;
  fs->pc = 0;
  fs->lasttarget = 0;
  fs->jpc = NO_JMP;
  fs->freereg = 0;
  fs->nkgc = 0;
  fs->nkn = 0;
  fs->nactvar = 0;
  fs->nuv = 0;
  fs->bl = NULL;
  fs->flags = 0;
  fs->framesize = 1;  /* Minimum frame size. */
  fs->kt = lj_tab_new(L, 0, 0);
  /* Anchor table of constants in stack to avoid being collected. */
  settabV(L, L->top, fs->kt);
  incr_top(L);
}